

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

void Gia_MiniAigSuperGates_rec(Mini_Aig_t *p,int iObj,Vec_Int_t *vRes,Vec_Int_t *vMap)

{
  int iVar1;
  int Lit;
  int iVar2;
  int iFan1;
  int iFan0;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vRes_local;
  int iObj_local;
  Mini_Aig_t *p_local;
  
  iVar1 = Mini_AigNodeIsPi(p,iObj);
  if (iVar1 == 0) {
    iVar1 = Mini_AigNodeFanin0(p,iObj);
    Lit = Mini_AigNodeFanin1(p,iObj);
    iVar2 = Abc_LitIsCompl(iVar1);
    if (iVar2 != 0) {
      __assert_fail("!Abc_LitIsCompl(iFan0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                    ,0x336,
                    "void Gia_MiniAigSuperGates_rec(Mini_Aig_t *, int, Vec_Int_t *, Vec_Int_t *)");
    }
    iVar2 = Abc_LitIsCompl(Lit);
    if (iVar2 != 0) {
      __assert_fail("!Abc_LitIsCompl(iFan1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                    ,0x337,
                    "void Gia_MiniAigSuperGates_rec(Mini_Aig_t *, int, Vec_Int_t *, Vec_Int_t *)");
    }
    iVar1 = Abc_Lit2Var(iVar1);
    Gia_MiniAigSuperGates_rec(p,iVar1,vRes,vMap);
    iVar1 = Abc_Lit2Var(Lit);
    Gia_MiniAigSuperGates_rec(p,iVar1,vRes,vMap);
  }
  else {
    iVar1 = Vec_IntEntry(vMap,iObj);
    if (iVar1 < 0) {
      __assert_fail("Vec_IntEntry(vMap, iObj) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                    ,0x330,
                    "void Gia_MiniAigSuperGates_rec(Mini_Aig_t *, int, Vec_Int_t *, Vec_Int_t *)");
    }
    iVar1 = Vec_IntEntry(vMap,iObj);
    Vec_IntPush(vRes,iVar1);
  }
  return;
}

Assistant:

void Gia_MiniAigSuperGates_rec( Mini_Aig_t * p, int iObj, Vec_Int_t * vRes, Vec_Int_t * vMap )
{
    int iFan0, iFan1;
    if ( Mini_AigNodeIsPi(p, iObj) )
    {
        assert( Vec_IntEntry(vMap, iObj) >= 0 );
        Vec_IntPush( vRes, Vec_IntEntry(vMap, iObj) );
        return;
    }
    iFan0 = Mini_AigNodeFanin0( p, iObj );
    iFan1 = Mini_AigNodeFanin1( p, iObj );
    assert( !Abc_LitIsCompl(iFan0) );
    assert( !Abc_LitIsCompl(iFan1) );
    Gia_MiniAigSuperGates_rec( p, Abc_Lit2Var(iFan0), vRes, vMap );
    Gia_MiniAigSuperGates_rec( p, Abc_Lit2Var(iFan1), vRes, vMap );
}